

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O0

integer_t __thiscall
tchecker::vm_t::interpret_instruction
          (vm_t *this,bytecode_t **bytecode,intval_t *intval,clock_constraint_container_t *clkconstr
          ,clock_reset_container_t *clkreset)

{
  bytecode_t *pbVar1;
  uint uVar2;
  bool bVar3;
  unsigned_short uVar4;
  capacity_t_conflict cVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  out_of_range *this_00;
  int *piVar9;
  integer_t *piVar10;
  reference this_01;
  uint *puVar11;
  runtime_error *this_02;
  bool local_35d;
  ulong local_310;
  ushort local_306;
  uint local_304;
  uint uStack_300;
  unsigned_short id_4;
  uint value_3;
  uint id_3;
  int value_2;
  long id_2;
  uint local_2e8;
  uint left_id;
  uint right_id;
  int value_1;
  uint local_2d8;
  uint id1;
  uint id2;
  int bound;
  bytecode_t cmp;
  int local_2c0;
  int v_2;
  int v_1;
  int left_11;
  int right_11;
  int left_10;
  int right_10;
  int left_9;
  int right_9;
  int left_8;
  int right_8;
  int left_7;
  int right_7;
  int left_6;
  int right_6;
  int left_5;
  int right_5;
  int left_4;
  int right_4;
  int left_3;
  int right_3;
  int left_2;
  int right_2;
  int left_1;
  int right_1;
  int left;
  int right;
  unsigned_short id_1;
  int value;
  unsigned_short id;
  bytecode_t v;
  bytecode_t shift_1;
  bytecode_t shift;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  stringstream local_1e0 [8];
  stringstream ss;
  undefined1 local_1d0 [376];
  long local_58;
  long offset;
  bytecode_t h;
  bytecode_t l;
  vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>> *pvStack_38;
  int val;
  clock_reset_container_t *clkreset_local;
  clock_constraint_container_t *clkconstr_local;
  intval_t *intval_local;
  bytecode_t **bytecode_local;
  vm_t *this_local;
  
  pvStack_38 = (vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>> *)clkreset;
  clkreset_local = (clock_reset_container_t *)clkconstr;
  clkconstr_local = (clock_constraint_container_t *)intval;
  intval_local = (intval_t *)bytecode;
  bytecode_local = (bytecode_t **)this;
  switch(**bytecode) {
  case 0:
    l._4_4_ = top_and_pop<int>(this);
    sVar7 = size(this);
    if (sVar7 != 0) {
      __assert_fail("size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0xed,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    clear(this);
    this->_return = true;
    this_local._4_4_ = l._4_4_;
    break;
  case 1:
    iVar6 = top<int>(this);
    if (iVar6 == 0) {
      clear(this);
      this->_return = true;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = top<int>(this);
    }
    break;
  case 2:
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    h = pbVar1[1];
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    offset = pbVar1[1];
    local_58 = top<long>(this);
    bVar3 = contains_value<int,long>(h);
    if (!bVar3) {
      __assert_fail("contains_value<tchecker::integer_t>(l)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x103,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    bVar3 = contains_value<int,long>(offset);
    if (!bVar3) {
      __assert_fail("contains_value<tchecker::integer_t>(h)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x104,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    bVar3 = contains_value<int,long>(local_58);
    if (!bVar3) {
      __assert_fail("contains_value<tchecker::integer_t>(offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x105,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    if ((local_58 < h) || (offset < local_58)) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar8 = (ostream *)std::ostream::operator<<(local_1d0,local_58);
      poVar8 = std::operator<<(poVar8," out of [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,h);
      poVar8 = std::operator<<(poVar8,", ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,offset);
      std::operator<<(poVar8,"]");
      shift._7_1_ = 1;
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::operator+(&local_210,"out-of-bounds value: ",&local_230);
      std::out_of_range::out_of_range(this_00,(string *)&local_210);
      shift._7_1_ = 0;
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    this_local._4_4_ = top<int>(this);
    break;
  case 3:
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    *bytecode = *bytecode + pbVar1[1];
    this_local._4_4_ = 1;
    break;
  case 4:
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    v = pbVar1[1];
    iVar6 = top_and_pop<int>(this);
    if (iVar6 == 0) {
      intval_local->super_integer_array_t =
           (integer_array_t)(v * 8 + (long)intval_local->super_integer_array_t);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
    break;
  case 5:
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    _value = pbVar1[1];
    push<long>(this,_value);
    this_local._4_4_ = top<int>(this);
    break;
  case 6:
    uVar4 = top_and_pop<unsigned_short>(this);
    id_1 = uVar4;
    cVar5 = intval_t::size((intval_t *)clkconstr_local);
    if (cVar5 <= uVar4) {
      __assert_fail("id < intval.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x133,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    piVar9 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                       ((make_array_t<int,_4UL,_tchecker::intval_base_t> *)clkconstr_local,id_1);
    push<int>(this,*piVar9);
    this_local._4_4_ = top<int>(this);
    break;
  case 7:
    right = top_and_pop<int>(this);
    uVar4 = top_and_pop<unsigned_short>(this);
    left._2_2_ = uVar4;
    cVar5 = intval_t::size((intval_t *)clkconstr_local);
    iVar6 = right;
    if (cVar5 <= uVar4) {
      __assert_fail("id < intval.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x13c,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    piVar9 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                       ((make_array_t<int,_4UL,_tchecker::intval_base_t> *)clkconstr_local,
                        left._2_2_);
    *piVar9 = iVar6;
    this_local._4_4_ = right;
    break;
  case 8:
    right_1 = top_and_pop<int>(this);
    left_1 = top_and_pop<int>(this);
    local_35d = left_1 != 0 && right_1 != 0;
    push<int>(this,(uint)local_35d);
    this_local._4_4_ = top<int>(this);
    break;
  case 9:
    right_2 = top_and_pop<int>(this);
    left_2 = top_and_pop<int>(this);
    push<int>(this,left_2 - right_2);
    this_local._4_4_ = top<int>(this);
    break;
  case 10:
    right_3 = top_and_pop<int>(this);
    left_3 = top_and_pop<int>(this);
    push<int>(this,left_3 / right_3);
    this_local._4_4_ = top<int>(this);
    break;
  case 0xb:
    right_4 = top_and_pop<int>(this);
    left_4 = top_and_pop<int>(this);
    push<int>(this,(uint)(left_4 == right_4));
    this_local._4_4_ = top<int>(this);
    break;
  case 0xc:
    right_5 = top_and_pop<int>(this);
    left_5 = top_and_pop<int>(this);
    push<int>(this,(uint)(right_5 <= left_5));
    this_local._4_4_ = top<int>(this);
    break;
  case 0xd:
    right_6 = top_and_pop<int>(this);
    left_6 = top_and_pop<int>(this);
    push<int>(this,(uint)(right_6 < left_6));
    this_local._4_4_ = top<int>(this);
    break;
  case 0xe:
    right_7 = top_and_pop<int>(this);
    left_7 = top_and_pop<int>(this);
    push<int>(this,(uint)(left_7 < right_7));
    this_local._4_4_ = top<int>(this);
    break;
  case 0xf:
    right_8 = top_and_pop<int>(this);
    left_8 = top_and_pop<int>(this);
    push<int>(this,(uint)(left_8 <= right_8));
    this_local._4_4_ = top<int>(this);
    break;
  case 0x10:
    right_9 = top_and_pop<int>(this);
    left_9 = top_and_pop<int>(this);
    push<int>(this,left_9 * right_9);
    this_local._4_4_ = top<int>(this);
    break;
  case 0x11:
    right_10 = top_and_pop<int>(this);
    left_10 = top_and_pop<int>(this);
    push<int>(this,left_10 % right_10);
    this_local._4_4_ = top<int>(this);
    break;
  case 0x12:
    right_11 = top_and_pop<int>(this);
    left_11 = top_and_pop<int>(this);
    push<int>(this,(uint)(left_11 != right_11));
    this_local._4_4_ = top<int>(this);
    break;
  case 0x13:
    v_1 = top_and_pop<int>(this);
    v_2 = top_and_pop<int>(this);
    push<int>(this,v_2 + v_1);
    this_local._4_4_ = top<int>(this);
    break;
  case 0x14:
    local_2c0 = top_and_pop<int>(this);
    push<int>(this,-local_2c0);
    this_local._4_4_ = top<int>(this);
    break;
  case 0x15:
    cmp._4_4_ = top_and_pop<int>(this);
    push<int>(this,(uint)((cmp._4_4_ != 0 ^ 0xffU) & 1));
    this_local._4_4_ = top<int>(this);
    break;
  case 0x16:
    pbVar1 = *bytecode;
    *bytecode = pbVar1 + 1;
    _id2 = pbVar1[1];
    id1 = top_and_pop<int>(this);
    local_2d8 = top_and_pop<unsigned_int>(this);
    value_1 = top_and_pop<unsigned_int>(this);
    right_id = (uint)(_id2 != 0);
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int_const&,unsigned_int_const&,tchecker::ineq_cmp_t,int_const&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               clkreset_local,(uint *)&value_1,&local_2d8,&right_id,(int *)&id1);
    this_local._4_4_ = 1;
    break;
  case 0x17:
    left_id = top_and_pop<int>(this);
    local_2e8 = top_and_pop<unsigned_int>(this);
    id_2._4_4_ = top_and_pop<unsigned_int>(this);
    std::vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>::
    emplace_back<unsigned_int_const&,unsigned_int_const&,int_const&>
              (pvStack_38,(uint *)((long)&id_2 + 4),&local_2e8,(int *)&left_id);
    this_local._4_4_ = 1;
    break;
  case 0x18:
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::emplace_back<>(&this->_frames);
    this_local._4_4_ = 1;
    break;
  case 0x19:
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::pop_back(&this->_frames);
    this_local._4_4_ = 1;
    break;
  case 0x1a:
    _id_3 = top_and_pop<long>(this);
    piVar10 = slot_of(this,_id_3);
    push<int>(this,*piVar10);
    this_local._4_4_ = top<int>(this);
    break;
  case 0x1b:
    value_3 = top_and_pop<int>(this);
    uStack_300 = top_and_pop<unsigned_int>(this);
    uVar2 = value_3;
    puVar11 = (uint *)slot_of(this,(ulong)uStack_300);
    *puVar11 = uVar2;
    this_local._4_4_ = value_3;
    break;
  case 0x1c:
    local_304 = top_and_pop<unsigned_int>(this);
    local_306 = top_and_pop<unsigned_short>(this);
    uVar2 = local_304;
    this_01 = std::
              vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
              ::back(&this->_frames);
    local_310 = (ulong)local_306;
    puVar11 = (uint *)std::
                      map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
                      ::operator[](this_01,(key_type_conflict *)&local_310);
    *puVar11 = uVar2;
    this_local._4_4_ = 0;
    break;
  case 0x1d:
    this_local._4_4_ = 1;
    break;
  default:
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"incomplete switch statement");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this_local._4_4_;
}

Assistant:

inline tchecker::integer_t interpret_instruction(tchecker::bytecode_t const *& bytecode, tchecker::intval_t & intval,
                                                   tchecker::clock_constraint_container_t & clkconstr,
                                                   tchecker::clock_reset_container_t & clkreset)
  {
    // Assume stack=v1 ... vK where vK is the top symbol
    switch (*bytecode) {
      // end of operation, return vK
    case VM_RET: {
      auto val = top_and_pop<tchecker::integer_t>();
      assert(size() == 0);
      clear();
      _return = true;
      return val;
    }

      // end of operation when vK==0, return 0
    case VM_RETZ: {
      if (top<tchecker::integer_t>() == 0) {
        clear();
        _return = true;
        return 0;
      }
      return top<tchecker::integer_t>();
    }

      // raise exception when not (l <= vK <= h) for parameters l and h
      // of instruction VM_FAILNOTIN
    case VM_FAILNOTIN: {
      tchecker::bytecode_t const l = *++bytecode;
      tchecker::bytecode_t const h = *++bytecode;
      auto const offset = top<tchecker::bytecode_t>();
      assert(contains_value<tchecker::integer_t>(l));
      assert(contains_value<tchecker::integer_t>(h));
      assert(contains_value<tchecker::integer_t>(offset));
      if ((offset < l) || (offset > h)) {
        std::stringstream ss;
        ss << offset << " out of [" << l << ", " << h << "]";
        throw std::out_of_range("out-of-bounds value: " + ss.str());
      }

      return top<tchecker::integer_t>();
    }

      // unconditional jump relatively to next instruction;
      // offset is a parameter of the instruction
    case VM_JMP: {
      tchecker::bytecode_t const shift = *++bytecode;
      // jump is relative to the address of the next instruction:
      // - bytecode++;
      // but we have to handle the increment of the IP in the main loop:
      // - bytecode += shift - 1;
      // so:
      bytecode += shift;

      return 1;
    }
      // stack = v1 ... vK   jump if vK == 0
      // offset is a parameter of the instruction
    case VM_JMPZ: {
      tchecker::bytecode_t const shift = *++bytecode;

      if (top_and_pop<tchecker::integer_t>() == 0) {
        bytecode += shift;
        return 0;
      }
      return 1;
    }

      // stack = v1 ... vK v   where v is a parameter of instruction VM_PUSH
    case VM_PUSH: {
      tchecker::bytecode_t const v = *++bytecode;
      push<tchecker::bytecode_t>(v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... [vK]   vK replaced by value at ID vK in intvars
      // valuation
    case VM_VALUEAT: {
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      push<tchecker::integer_t>(intval[id]);
      return top<tchecker::integer_t>();
    }

      // [vK-1] = vK, stack = v1 ... vK-2
    case VM_ASSIGN: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      intval[id] = value;
      return value;
    }

      // stack = v1 ... vK-2 (vK-1 && vK)
    case VM_LAND: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left && right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 - vK)
    case VM_MINUS: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left - right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 / vK)
    case VM_DIV: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left / right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 == vK)
    case VM_EQ: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left == right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 >= vK)
    case VM_GE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left >= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 > vK)
    case VM_GT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left > right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 < vK)
    case VM_LT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left < right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 <= vK)
    case VM_LE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left <= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 * vK)
    case VM_MUL: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left * right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 % vK)
    case VM_MOD: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left % right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 != vK)
    case VM_NE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left != right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 + vK)
    case VM_SUM: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left + right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (- vK)
    case VM_NEG: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(-v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (! vK)
    case VM_LNOT: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(!v);
      return top<tchecker::integer_t>();
    }

      // no-operation
    case VM_NOP:
      return 1;

      // stack = v1 ... vK-4 1  output (vK-2 vK-1 s vK)   where s is a
      // parameter of VM_CLKCONSTR (strictness)
    case VM_CLKCONSTR: {
      tchecker::bytecode_t cmp = *++bytecode;
      auto const bound = top_and_pop<tchecker::integer_t>();
      auto const id2 = top_and_pop<tchecker::clock_id_t>();
      auto const id1 = top_and_pop<tchecker::clock_id_t>();
      static_assert(tchecker::LT == 0, "");
      clkconstr.emplace_back(id1, id2, (cmp == 0 ? tchecker::LT : tchecker::LE), bound);
      return 1;
    }

      // stack = v1 ... vK-3    output (vK-2 vK-1 vK)
    case VM_CLKRESET: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const right_id = top_and_pop<tchecker::clock_id_t>();
      auto const left_id = top_and_pop<tchecker::clock_id_t>();
      clkreset.emplace_back(left_id, right_id, value);
      return 1;
    }

      // push a new frame for local variables
    case VM_PUSH_FRAME: {
      _frames.emplace_back();
      return 1;
    }
      // pop the top-level frame
    case VM_POP_FRAME: {
      _frames.pop_back();
      return 1;
    }

      // stack = v1 ... vK-1 [vK]
      // vK is replaced by the value of the local variable identified by vK.
    case VM_VALUEAT_FRAME: {
      auto const id = top_and_pop<tchecker::bytecode_t>();
      push<tchecker::integer_t>(slot_of(id));
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2
      // [vK-1] is assigned vK where vK-1 identifies a local variables.
    case VM_ASSIGN_FRAME: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intvar_id_t>();
      slot_of(id) = value;
      return value;
    }

      // stack = v1 ... vK-2
      // [vK-1] is initialized with vK where vK-1 identifies a local variables.
    case VM_INIT_FRAME: {
      auto const value = top_and_pop<tchecker::intvar_id_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      _frames.back()[id] = static_cast<tchecker::integer_t>(value);

      return 0;
    }
    }

    // should never be reached
    throw std::runtime_error("incomplete switch statement");
  }